

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

filemgr_open_result
filemgr_open(char *filename,filemgr_ops *ops,filemgr_config *config,err_log_callback *log_callback)

{
  avl_node **ppaVar1;
  byte bVar2;
  superblock *psVar3;
  fdb_status fVar4;
  fdb_status fVar5;
  int iVar6;
  hash_elem *e;
  filemgr *file;
  size_t sVar7;
  char *__dest;
  wal *pwVar8;
  filemgr_config *pfVar9;
  list *plVar10;
  wal_txn_wrapper *pwVar11;
  uint64_t uVar12;
  hash_elem *phVar13;
  uint uVar14;
  __int_type _Var15;
  avl_node **ppaVar16;
  filemgr_open_result fVar17;
  plock_config local_390;
  plock_ops pops;
  filemgr query;
  
  bVar2 = config->options;
  filemgr_init(config);
  if (((config->encryption_key).algorithm != 0) && (global_config.ncacheblock < 1)) {
    file = (filemgr *)0x0;
    _Var15 = 0xffffffd4;
    goto LAB_00125f51;
  }
  query.filename = filename;
  pthread_spin_lock(&filemgr_openlock);
  e = hash_find(&hash,&query.e);
  if (e == (hash_elem *)0x0) {
    uVar14 = (uint)((bVar2 & 8) >> 3) << 6 | 2;
LAB_001258c9:
    fVar4 = (*ops->open)(filename,uVar14 | config->flag,0x1b6);
    _Var15 = (__int_type)(uint)fVar4;
    if (fVar4 < FDB_RESULT_SUCCESS) {
LAB_001259b8:
      _log_errno_str(ops,log_callback,fVar4,"OPEN",filename);
    }
    else {
      file = (filemgr *)calloc(1,0x2f0);
      sVar7 = strlen(filename);
      file->filename_len = (uint16_t)sVar7;
      __dest = (char *)malloc((sVar7 & 0xffff) + 1);
      file->filename = __dest;
      strcpy(__dest,filename);
      LOCK();
      (file->ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      file->stale_list = (list *)0x0;
      fVar5 = fdb_init_encryptor(&file->encryption,&config->encryption_key);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        (*ops->close)(fVar4);
        free(file);
        pthread_spin_unlock(&filemgr_openlock);
        file = (filemgr *)0x0;
        _Var15 = (__int_type)(uint)fVar5;
        goto LAB_00125f51;
      }
      pwVar8 = (wal *)calloc(1,0x68);
      file->wal = pwVar8;
      pwVar8->flag = '\0';
      file->ops = ops;
      file->blocksize = global_config.blocksize;
      LOCK();
      (file->status).super___atomic_base<unsigned_char>._M_i = '\0';
      UNLOCK();
      pfVar9 = (filemgr_config *)malloc(0x60);
      file->config = pfVar9;
      filemgr_config::operator=(pfVar9,config);
      iVar6 = global_config.ncacheblock;
      pfVar9 = file->config;
      pfVar9->blocksize = global_config.blocksize;
      pfVar9->ncacheblock = iVar6;
      file->old_filename = (char *)0x0;
      file->new_filename = (char *)0x0;
      file->fd = fVar4;
      _Var15 = (*file->ops->goto_eof)(fVar4);
      if (-1 < (long)_Var15) {
        LOCK();
        (file->last_commit).super___atomic_base<unsigned_long>._M_i = _Var15;
        UNLOCK();
        LOCK();
        (file->last_writable_bmp_revnum).super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        LOCK();
        (file->pos).super___atomic_base<unsigned_long>._M_i = _Var15;
        UNLOCK();
        LOCK();
        (file->latest_filesize).super___atomic_base<unsigned_long>._M_i = _Var15;
        UNLOCK();
        LOCK();
        (file->throttling_delay).super___atomic_base<unsigned_int>._M_i = 0;
        UNLOCK();
        LOCK();
        (file->num_invalidated_blocks).super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        LOCK();
        (file->io_in_prog).super___atomic_base<unsigned_char>._M_i = '\0';
        UNLOCK();
        LOCK();
        (file->bcache)._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        file->in_place_compaction = false;
        file->kv_header = (kvs_header *)0x0;
        LOCK();
        (file->prefetch_status).super___atomic_base<unsigned_char>._M_i = '\0';
        UNLOCK();
        LOCK();
        (file->header).bid.super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        LOCK();
        (file->header).op_stat.num_sets.super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        LOCK();
        (file->header).op_stat.num_dels.super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        LOCK();
        (file->header).op_stat.num_commits.super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        LOCK();
        (file->header).op_stat.num_compacts.super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        LOCK();
        (file->header).op_stat.num_gets.super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        LOCK();
        (file->header).op_stat.num_iterator_gets.super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        LOCK();
        (file->header).op_stat.num_iterator_moves.super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        pthread_spin_init(&file->lock,1);
        plVar10 = (list *)calloc(1,0x10);
        file->stale_list = plVar10;
        avl_init(&file->stale_info_tree,(void *)0x0);
        avl_init(&file->mergetree,(void *)0x0);
        LOCK();
        (file->stale_info_tree_loaded)._M_base._M_i = false;
        UNLOCK();
        avl_init(&file->dirty_update_idx,(void *)0x0);
        pthread_spin_init(&file->dirty_update_lock,1);
        LOCK();
        (file->dirty_update_counter).super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        file->latest_dirty_update = (filemgr_dirty_update_node *)0x0;
        pthread_spin_init(&file->fhandle_idx_lock,1);
        avl_init(&file->fhandle_idx,(void *)0x0);
        local_390.ops = &pops;
        pops.init_user = mutex_init_wrap;
        pops.lock_user = mutex_lock_wrap;
        pops.unlock_user = mutex_unlock_wrap;
        pops.destroy_user = mutex_destroy_wrap;
        pops.init_internal = spin_init_wrap;
        pops.lock_internal = spin_lock_wrap;
        pops.unlock_internal = spin_unlock_wrap;
        pops.destroy_internal = spin_destroy_wrap;
        pops.is_overlapped = _block_is_overlapped;
        local_390.sizeof_lock_internal = 4;
        local_390.sizeof_lock_user = 0x28;
        local_390.sizeof_range = 8;
        local_390.aux = (void *)0x0;
        plock_init(&file->plock,&local_390);
        pthread_mutex_init((pthread_mutex_t *)&file->writer_lock,(pthread_mutexattr_t *)0x0);
        (file->writer_lock).locked = false;
        file->crc_mode = CRC32;
        do {
          fVar4 = _filemgr_load_sb(file,log_callback);
          if ((fVar4 != FDB_RESULT_SB_READ_FAIL) &&
             (_Var15 = (__int_type)(uint)fVar4, fVar4 != FDB_RESULT_SUCCESS)) {
            _log_errno_str(file->ops,log_callback,fVar4,"READ",file->filename);
            (*file->ops->close)(file->fd);
LAB_00125f12:
            free(file->stale_list);
            goto LAB_00125f1e;
          }
          fVar4 = _filemgr_read_header(file,log_callback);
          _Var15 = (__int_type)(uint)fVar4;
          psVar3 = file->sb;
          if ((fVar4 != FDB_RESULT_SUCCESS) &&
             (fVar4 != FDB_RESULT_NO_DB_HEADERS || psVar3 == (superblock *)0x0)) {
            _log_errno_str(file->ops,log_callback,fVar4,"READ",filename);
            (*file->ops->close)(file->fd);
            if (file->sb != (superblock *)0x0) {
              (*sb_ops.release)(file);
            }
            goto LAB_00125f12;
          }
        } while ((psVar3 != (superblock *)0x0) &&
                ((file->header).revnum !=
                 (psVar3->last_hdr_revnum).super___atomic_base<unsigned_long>._M_i));
        iVar6 = wal_is_initialized(file);
        if (iVar6 == 0) {
          wal_init(file,0x1003);
        }
        pwVar11 = (wal_txn_wrapper *)malloc(0x18);
        (file->global_txn).wrapper = pwVar11;
        (pwVar11->field_1).txn = &file->global_txn;
        (file->global_txn).handle = (fdb_kvs_handle *)0x0;
        if ((file->pos).super___atomic_base<unsigned_long>._M_i == 0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = (file->pos).super___atomic_base<unsigned_long>._M_i / (ulong)file->blocksize - 1;
        }
        (file->global_txn).prev_hdr_bid = uVar12;
        (file->global_txn).prev_revnum = 0;
        plVar10 = (list *)calloc(1,0x10);
        (file->global_txn).items = plVar10;
        (file->global_txn).isolation = '\x02';
        wal_add_transaction(file,&file->global_txn);
        hash_insert(&hash,&file->e);
        if (config->prefetch_duration != 0) {
          filemgr_prefetch(file,config,log_callback);
        }
        pthread_spin_unlock(&filemgr_openlock);
        file->fflags = file->fflags & 0xfe | config->options & 1;
        _Var15 = 0;
        fdb_log_impl(log_callback,4,FDB_RESULT_SUCCESS,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                     ,"filemgr_open",0x445,"Forestdb opened database file %s, ref count %zu",
                     filename,(ulong)(file->ref_count).super___atomic_base<unsigned_int>._M_i);
        goto LAB_00125f51;
      }
      _log_errno_str(file->ops,log_callback,(fdb_status)_Var15,"SEEK_END",filename);
      (*file->ops->close)(file->fd);
LAB_00125f1e:
      free(file->wal);
      free(file->filename);
      free(file->config);
      free(file);
    }
    pthread_spin_unlock(&filemgr_openlock);
LAB_00125f4f:
    file = (filemgr *)0x0;
  }
  else {
    LOCK();
    ppaVar16 = &e[-10].avl.left;
    iVar6 = *(int *)ppaVar16;
    *(int *)ppaVar16 = *(int *)ppaVar16 + 1;
    UNLOCK();
    file = (filemgr *)(e + -10);
    if ((0xfffffffd < iVar6 - 1U) || (*(char *)&e[1].avl.parent == '\x03')) {
      ppaVar16 = &e[7].avl.left;
      pthread_spin_lock((pthread_spinlock_t *)ppaVar16);
      if (*(char *)&e[1].avl.parent == '\x03') {
        filemgr_config::operator=((filemgr_config *)e[1].avl.left,config);
        (e[1].avl.left)->parent =
             (avl_node *)CONCAT44(global_config.ncacheblock,global_config.blocksize);
        fVar4 = (*(code *)(e[-1].avl.right)->parent)
                          (e[-10].avl.parent,(uint)((bVar2 & 8) >> 3) << 6 | config->flag | 2,0x1b6)
        ;
        *(fdb_status *)((long)&e[-10].avl.right + 4) = fVar4;
        if (FDB_RESULT_INVALID_ARGS < fVar4) {
          LOCK();
          *(undefined1 *)&e[1].avl.parent = 0;
          UNLOCK();
          _Var15 = 0;
          *(byte *)((long)&e[-10].avl.left + 4) =
               *(byte *)((long)&e[-10].avl.left + 4) & 0xfe | config->options & 1;
          pthread_spin_unlock((pthread_spinlock_t *)ppaVar16);
          pthread_spin_unlock(&filemgr_openlock);
          goto LAB_00125f51;
        }
        if (fVar4 == FDB_RESULT_NO_SUCH_FILE) {
          pthread_spin_unlock((pthread_spinlock_t *)ppaVar16);
          phVar13 = hash_remove(&hash,e);
          if (phVar13 == (hash_elem *)0x0) {
            fdb_assert_die("ret",
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                           ,0x335,0,0);
          }
          filemgr_free_func(e);
          uVar14 = 0x42;
          if ((bVar2 & 8) != 0) goto LAB_001258c9;
          _Var15 = 0xfffffffd;
          fVar4 = FDB_RESULT_NO_SUCH_FILE;
          goto LAB_001259b8;
        }
        _log_errno_str((filemgr_ops *)e[-1].avl.right,log_callback,fVar4,"OPEN",filename);
        LOCK();
        ppaVar1 = &e[-10].avl.left;
        *(int *)ppaVar1 = *(int *)ppaVar1 + -1;
        UNLOCK();
        pthread_spin_unlock((pthread_spinlock_t *)ppaVar16);
        pthread_spin_unlock(&filemgr_openlock);
        _Var15 = (__int_type)*(uint *)((long)&e[-10].avl.right + 4);
        goto LAB_00125f4f;
      }
      *(byte *)((long)&e[-10].avl.left + 4) =
           *(byte *)((long)&e[-10].avl.left + 4) & 0xfe | config->options & 1;
      pthread_spin_unlock((pthread_spinlock_t *)ppaVar16);
    }
    pthread_spin_unlock(&filemgr_openlock);
    _Var15 = 0;
  }
LAB_00125f51:
  fVar17._8_8_ = _Var15 & 0xffffffff;
  fVar17.file = file;
  return fVar17;
}

Assistant:

filemgr_open_result filemgr_open(char *filename, struct filemgr_ops *ops,
                                 struct filemgr_config *config,
                                 err_log_callback *log_callback)
{
    struct filemgr *file = NULL;
    struct filemgr query;
    struct hash_elem *e = NULL;
    bool create = config->options & FILEMGR_CREATE;
    int file_flag = 0x0;
    int fd = -1;
    fdb_status status;
    filemgr_open_result result = {NULL, FDB_RESULT_OPEN_FAIL};

    filemgr_init(config);

    if (config->encryption_key.algorithm != FDB_ENCRYPTION_NONE && global_config.ncacheblock <= 0) {
        // cannot use encryption without a block cache
        result.rv = FDB_RESULT_CRYPTO_ERROR;
        return result;
    }

    // check whether file is already opened or not
    query.filename = filename;
    spin_lock(&filemgr_openlock);
    e = hash_find(&hash, &query.e);

    if (e) {
        // already opened (return existing structure)
        file = _get_entry(e, struct filemgr, e);

        if (atomic_incr_uint32_t(&file->ref_count) > 1 &&
            atomic_get_uint8_t(&file->status) != FILE_CLOSED) {
            spin_unlock(&filemgr_openlock);
            result.file = file;
            result.rv = FDB_RESULT_SUCCESS;
            return result;
        }

        spin_lock(&file->lock);

        if (atomic_get_uint8_t(&file->status) == FILE_CLOSED) { // if file was closed before
            file_flag = O_RDWR;
            if (create) {
                file_flag |= O_CREAT;
            }
            *file->config = *config;
            file->config->blocksize = global_config.blocksize;
            file->config->ncacheblock = global_config.ncacheblock;
            file_flag |= config->flag;
            file->fd = file->ops->open(file->filename, file_flag, 0666);
            if (file->fd < 0) {
                if (file->fd == FDB_RESULT_NO_SUCH_FILE) {
                    // A database file was manually deleted by the user.
                    // Clean up global hash table, WAL index, and buffer cache.
                    // Then, retry it with a create option below IFF it is not
                    // a read-only open attempt
                    struct hash_elem *ret;
                    spin_unlock(&file->lock);
                    ret = hash_remove(&hash, &file->e);
                    fdb_assert(ret, 0, 0);
                    filemgr_free_func(&file->e);
                    if (!create) {
                        _log_errno_str(ops, log_callback,
                                FDB_RESULT_NO_SUCH_FILE, "OPEN", filename);
                        spin_unlock(&filemgr_openlock);
                        result.rv = FDB_RESULT_NO_SUCH_FILE;
                        return result;
                    }
                } else {
                    _log_errno_str(file->ops, log_callback,
                                  (fdb_status)file->fd, "OPEN", filename);
                    atomic_decr_uint32_t(&file->ref_count);
                    spin_unlock(&file->lock);
                    spin_unlock(&filemgr_openlock);
                    result.rv = file->fd;
                    return result;
                }
            } else { // Reopening the closed file is succeed.
                atomic_store_uint8_t(&file->status, FILE_NORMAL);
                if (config->options & FILEMGR_SYNC) {
                    file->fflags |= FILEMGR_SYNC;
                } else {
                    file->fflags &= ~FILEMGR_SYNC;
                }

                spin_unlock(&file->lock);
                spin_unlock(&filemgr_openlock);

                result.file = file;
                result.rv = FDB_RESULT_SUCCESS;
                return result;
            }
        } else { // file is already opened.

            if (config->options & FILEMGR_SYNC) {
                file->fflags |= FILEMGR_SYNC;
            } else {
                file->fflags &= ~FILEMGR_SYNC;
            }

            spin_unlock(&file->lock);
            spin_unlock(&filemgr_openlock);
            result.file = file;
            result.rv = FDB_RESULT_SUCCESS;
            return result;
        }
    }

    file_flag = O_RDWR;
    if (create) {
        file_flag |= O_CREAT;
    }
    file_flag |= config->flag;
    fd = ops->open(filename, file_flag, 0666);
    if (fd < 0) {
        _log_errno_str(ops, log_callback, (fdb_status)fd, "OPEN", filename);
        spin_unlock(&filemgr_openlock);
        result.rv = fd;
        return result;
    }
    file = (struct filemgr*)calloc(1, sizeof(struct filemgr));
    file->filename_len = strlen(filename);
    file->filename = (char*)malloc(file->filename_len + 1);
    strcpy(file->filename, filename);

    atomic_init_uint32_t(&file->ref_count, 1);
    file->stale_list = NULL;

    status = fdb_init_encryptor(&file->encryption, &config->encryption_key);
    if (status != FDB_RESULT_SUCCESS) {
        ops->close(fd);
        free(file);
        spin_unlock(&filemgr_openlock);
        result.rv = status;
        return result;
    }

    file->wal = (struct wal *)calloc(1, sizeof(struct wal));
    file->wal->flag = 0;

    file->ops = ops;
    file->blocksize = global_config.blocksize;
    atomic_init_uint8_t(&file->status, FILE_NORMAL);
    file->config = (struct filemgr_config*)malloc(sizeof(struct filemgr_config));
    *file->config = *config;
    file->config->blocksize = global_config.blocksize;
    file->config->ncacheblock = global_config.ncacheblock;
    file->old_filename = NULL;
    file->new_filename = NULL;
    file->fd = fd;

    cs_off_t offset = file->ops->goto_eof(file->fd);
    if (offset < 0) {
        _log_errno_str(file->ops, log_callback, (fdb_status) offset, "SEEK_END", filename);
        file->ops->close(file->fd);
        free(file->wal);
        free(file->filename);
        free(file->config);
        free(file);
        spin_unlock(&filemgr_openlock);
        result.rv = (fdb_status) offset;
        return result;
    }
    atomic_init_uint64_t(&file->last_commit, offset);
    atomic_init_uint64_t(&file->last_writable_bmp_revnum, 0);
    atomic_init_uint64_t(&file->pos, offset);
    atomic_init_uint64_t(&file->latest_filesize, offset);
    atomic_init_uint32_t(&file->throttling_delay, 0);
    atomic_init_uint64_t(&file->num_invalidated_blocks, 0);
    atomic_init_uint8_t(&file->io_in_prog, 0);

#ifdef _LATENCY_STATS
    for (int i = 0; i < FDB_LATENCY_NUM_STATS; ++i) {
        filemgr_init_latency_stat(&file->lat_stats[i]);
    }
#endif // _LATENCY_STATS

    file->bcache = NULL;
    file->in_place_compaction = false;
    file->kv_header = NULL;
    atomic_init_uint8_t(&file->prefetch_status, FILEMGR_PREFETCH_IDLE);

    atomic_init_uint64_t(&file->header.bid, 0);
    _init_op_stats(&file->header.op_stat);

    spin_init(&file->lock);
    file->stale_list = (struct list*)calloc(1, sizeof(struct list));
    list_init(file->stale_list);
    avl_init(&file->stale_info_tree, NULL);
    avl_init(&file->mergetree, NULL);
    file->stale_info_tree_loaded = false;

    filemgr_dirty_update_init(file);

    spin_init(&file->fhandle_idx_lock);
    avl_init(&file->fhandle_idx, NULL);

#ifdef __FILEMGR_DATA_PARTIAL_LOCK
    struct plock_ops pops;
    struct plock_config pconfig;

    pops.init_user = mutex_init_wrap;
    pops.lock_user = mutex_lock_wrap;
    pops.unlock_user = mutex_unlock_wrap;
    pops.destroy_user = mutex_destroy_wrap;
    pops.init_internal = spin_init_wrap;
    pops.lock_internal = spin_lock_wrap;
    pops.unlock_internal = spin_unlock_wrap;
    pops.destroy_internal = spin_destroy_wrap;
    pops.is_overlapped = _block_is_overlapped;

    memset(&pconfig, 0x0, sizeof(pconfig));
    pconfig.ops = &pops;
    pconfig.sizeof_lock_internal = sizeof(spin_t);
    pconfig.sizeof_lock_user = sizeof(mutex_t);
    pconfig.sizeof_range = sizeof(bid_t);
    pconfig.aux = NULL;
    plock_init(&file->plock, &pconfig);
#elif defined(__FILEMGR_DATA_MUTEX_LOCK)
    int i;
    for (i=0;i<DLOCK_MAX;++i) {
        mutex_init(&file->data_mutex[i]);
    }
#else
    int i;
    for (i=0;i<DLOCK_MAX;++i) {
        spin_init(&file->data_spinlock[i]);
    }
#endif //__FILEMGR_DATA_PARTIAL_LOCK

    mutex_init(&file->writer_lock.mutex);
    file->writer_lock.locked = false;

    // Note: CRC must be initialized before superblock loading
    // initialize CRC mode
    if (file->config && file->config->options & FILEMGR_CREATE_CRC32) {
        file->crc_mode = CRC32;
    } else {
        file->crc_mode = CRC_DEFAULT;
    }

    do { // repeat until both superblock and DB header are correctly read
        // init or load superblock
        status = _filemgr_load_sb(file, log_callback);
        // we can tolerate SB_READ_FAIL for old version file
        if (status != FDB_RESULT_SB_READ_FAIL &&
            status != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, status, "READ", file->filename);
            file->ops->close(file->fd);
            free(file->stale_list);
            free(file->wal);
            free(file->filename);
            free(file->config);
            free(file);
            spin_unlock(&filemgr_openlock);
            result.rv = status;
            return result;
        }

        // read header
        status = _filemgr_read_header(file, log_callback);
        if (file->sb && status == FDB_RESULT_NO_DB_HEADERS) {
            // this happens when user created & closed a file without any mutations,
            // thus there is no other data but superblocks.
            // we can tolerate this case.
        } else if (status != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, status, "READ", filename);
            file->ops->close(file->fd);
            if (file->sb) {
                sb_ops.release(file);
            }
            free(file->stale_list);
            free(file->wal);
            free(file->filename);
            free(file->config);
            free(file);
            spin_unlock(&filemgr_openlock);
            result.rv = status;
            return result;
        }

        if (file->sb &&
            file->header.revnum != atomic_get_uint64_t(&file->sb->last_hdr_revnum)) {
            // superblock exists but the corresponding DB header does not match.
            // read another candidate.
            continue;
        }

        break;
    } while (true);

    // initialize WAL
    if (!wal_is_initialized(file)) {
        wal_init(file, FDB_WAL_NBUCKET);
    }

    // init global transaction for the file
    file->global_txn.wrapper = (struct wal_txn_wrapper*)
                               malloc(sizeof(struct wal_txn_wrapper));
    file->global_txn.wrapper->txn = &file->global_txn;
    file->global_txn.handle = NULL;
    if (atomic_get_uint64_t(&file->pos)) {
        file->global_txn.prev_hdr_bid =
            (atomic_get_uint64_t(&file->pos) / file->blocksize) - 1;
    } else {
        file->global_txn.prev_hdr_bid = BLK_NOT_FOUND;
    }
    file->global_txn.prev_revnum = 0;
    file->global_txn.items = (struct list *)malloc(sizeof(struct list));
    list_init(file->global_txn.items);
    file->global_txn.isolation = FDB_ISOLATION_READ_COMMITTED;
    wal_add_transaction(file, &file->global_txn);

    hash_insert(&hash, &file->e);
    if (config->prefetch_duration > 0) {
        filemgr_prefetch(file, config, log_callback);
    }

    spin_unlock(&filemgr_openlock);

    if (config->options & FILEMGR_SYNC) {
        file->fflags |= FILEMGR_SYNC;
    } else {
        file->fflags &= ~FILEMGR_SYNC;
    }

    result.file = file;
    result.rv = FDB_RESULT_SUCCESS;
    fdb_log(log_callback, FDB_LOG_INFO, FDB_RESULT_SUCCESS,
            "Forestdb opened database file %s, ref count %zu",
            filename,
            atomic_get_uint32_t(&file->ref_count));

    return result;
}